

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void Net_WriteWeapon(PClassWeapon *type)

{
  uint *puVar1;
  uint uVar2;
  
  puVar1 = (uint *)TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::
                   CheckKey(&Weapons_hton,type);
  if (puVar1 == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *puVar1;
    if (0x7fff < uVar2) {
      __assert_fail("index >= 0 && index <= 32767",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_weapons.cpp"
                    ,0x725,"void Net_WriteWeapon(PClassWeapon *)");
    }
    if (0x7f < uVar2) {
      Net_WriteByte((byte)uVar2 | 0x80);
      uVar2 = uVar2 >> 7;
    }
  }
  Net_WriteByte((BYTE)uVar2);
  return;
}

Assistant:

void Net_WriteWeapon(PClassWeapon *type)
{
	int index, *index_p;

	index_p = Weapons_hton.CheckKey(type);
	if (index_p == NULL)
	{
		index = 0;
	}
	else
	{
		index = *index_p;
	}
	// 32767 weapons better be enough for anybody.
	assert(index >= 0 && index <= 32767);
	if (index < 128)
	{
		Net_WriteByte(index);
	}
	else
	{
		Net_WriteByte(0x80 | index);
		Net_WriteByte(index >> 7);
	}
}